

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test::
~TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test
          (TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test *this)

{
  TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test *this_local;
  
  ~TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithDoubleParameterAndTolerance)
{
    const SimpleString paramName = "paramName";
    double value = 1.2;
    double tolerance = 0.2;
    call->withParameter(paramName, value, tolerance);
    STRCMP_EQUAL("double", call->getInputParameterType(paramName).asCharString());
    DOUBLES_EQUAL(value, call->getInputParameter(paramName).getDoubleValue(), 0.0);
    DOUBLES_EQUAL(tolerance, call->getInputParameter(paramName).getDoubleTolerance(), 0.0);
    STRCMP_CONTAINS("funcName -> double paramName: <1.2>", call->callToString().asCharString());
}